

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-exceptions.hpp
# Opt level: O0

void __thiscall helics::HelicsSystemFailure::~HelicsSystemFailure(HelicsSystemFailure *this)

{
  void *in_RDI;
  
  ~HelicsSystemFailure((HelicsSystemFailure *)0x49f6c8);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

explicit HelicsSystemFailure(std::string_view message = "HELICS system failure") noexcept:
        HelicsException(message)
    {
    }